

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O3

void do_roll(CHAR_DATA *ch,char *argument)

{
  int to;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  OBJ_DATA *obj;
  size_t sVar4;
  char *txt;
  char buf [4608];
  char buf2 [4608];
  undefined8 local_2438;
  char acStack_2430 [4600];
  char local_1238 [4616];
  
  if (*argument == '\0') {
    act("You roll your eyes in disgust.",ch,(void *)0x0,(void *)0x0,3);
    act("$n rolls $s eyes, disgusted.",ch,(void *)0x0,(void *)0x0,0);
    return;
  }
  obj = get_obj_carry(ch,argument,ch);
  if (obj == (OBJ_DATA *)0x0) {
    txt = "Roll what?\n\r";
  }
  else if (obj->item_type == 7) {
    if (ch->fighting == (CHAR_DATA *)0x0) {
      bVar1 = is_ground(ch->in_room);
      if (bVar1) {
        uVar2 = obj->value[0];
        to = obj->value[1];
        if (1 < to && 0 < (int)uVar2) {
          if (uVar2 < 2) {
            local_2438._2_6_ = (uint6)((ulong)local_2438 >> 0x10) & 0xffffffffff00;
            local_2438._0_2_ = 0x7469;
          }
          else {
            local_2438._4_4_ = (uint)((ulong)local_2438 >> 0x20) & 0xffffff00;
            local_2438._0_4_ = 0x6d656874;
          }
          act("You cup your hands, rattle $p around, and roll $T.",ch,obj,&local_2438,3);
          act("$n cups $s hands, rattles $p around, and rolls $T.",ch,obj,&local_2438,0);
          act(".\n\r.\n\r.",ch,(void *)0x0,(void *)0x0,4);
          if (uVar2 == 1) {
            uVar2 = number_range(1,to);
            sprintf((char *)&local_2438,
                    "It rolls a brief distance before coming to a stop, showing a %d.",(ulong)uVar2)
            ;
          }
          else {
            builtin_strncpy(acStack_2430,"tter on the ground, coming to a stop showing: ",0x2f);
            local_2438._0_1_ = 'T';
            local_2438._1_1_ = 'h';
            local_2438._2_1_ = 'e';
            local_2438._3_1_ = 'y';
            local_2438._4_1_ = ' ';
            local_2438._5_1_ = 'c';
            local_2438._6_1_ = 'l';
            local_2438._7_1_ = 'a';
            do {
              uVar3 = number_range(1,to);
              sprintf(local_1238," %d",(ulong)uVar3);
              strcat((char *)&local_2438,local_1238);
              uVar2 = uVar2 - 1;
            } while (uVar2 != 0);
            sVar4 = strlen((char *)&local_2438);
            *(undefined2 *)((long)&local_2438 + sVar4) = 0x2e;
          }
          act((char *)&local_2438,ch,(void *)0x0,(void *)0x0,4);
          obj_from_char(obj);
          obj_to_room(obj,ch->in_room);
          return;
        }
        txt = "Something\'s wrong with these dice, and they can\'t be rolled.\n\r";
      }
      else {
        txt = "You need a hard surface beneath you on which to roll.\n\r";
      }
    }
    else {
      txt = "You really have more important things to worry about right now!\n\r";
    }
  }
  else {
    txt = "Those aren\'t dice!\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_roll(CHAR_DATA *ch, char *argument)
{
	char buf[MSL], buf2[MSL];
	OBJ_DATA *obj;
	int i, number, sides;

	if (argument[0] == '\0')
	{
		act("You roll your eyes in disgust.", ch, 0, 0, TO_CHAR);
		act("$n rolls $s eyes, disgusted.", ch, 0, 0, TO_ROOM);
		return;
	}

	obj = get_obj_carry(ch, argument, ch);

	if (obj == nullptr)
	{
		send_to_char("Roll what?\n\r", ch);
		return;
	}

	if (obj->item_type != ITEM_DICE)
	{
		send_to_char("Those aren't dice!\n\r", ch);
		return;
	}

	if (ch->fighting)
	{
		send_to_char("You really have more important things to worry about right now!\n\r", ch);
		return;
	}

	if (!is_ground(ch->in_room))
	{
		send_to_char("You need a hard surface beneath you on which to roll.\n\r", ch);
		return;
	}

	number = obj->value[0];
	sides = obj->value[1];

	if (number <= 0 || sides <= 1)
	{
		send_to_char("Something's wrong with these dice, and they can't be rolled.\n\r", ch);
		return;
	}

	if (number > 1)
		sprintf(buf, "them");
	else
		sprintf(buf, "it");

	act("You cup your hands, rattle $p around, and roll $T.", ch, obj, buf, TO_CHAR);
	act("$n cups $s hands, rattles $p around, and rolls $T.", ch, obj, buf, TO_ROOM);

	act(".\n\r.\n\r.", ch, 0, 0, TO_ALL);

	if (number == 1)
	{
		sprintf(buf, "It rolls a brief distance before coming to a stop, showing a %d.", number_range(1, sides));
	}
	else
	{
		sprintf(buf, "They clatter on the ground, coming to a stop showing: ");

		for (i = 0; i < number; i++)
		{
			sprintf(buf2, " %d", number_range(1, sides));
			strcat(buf, buf2);
		}

		strcat(buf, ".");
	}

	act(buf, ch, 0, 0, TO_ALL);

	obj_from_char(obj);
	obj_to_room(obj, ch->in_room);
}